

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.cpp
# Opt level: O2

void density_tests::all_queues_generic_tests
               (TestSettings *i_settings,QueueTesterFlags i_flags,ostream *i_output,
               uint32_t i_random_seed)

{
  bool bVar1;
  uint64_t uVar2;
  initializer_list<unsigned_long> __l;
  allocator_type local_13c9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nonblocking_thread_counts;
  unsigned_long local_13b0;
  EasyRandom rand;
  
  if (i_random_seed == 0) {
    EasyRandom::EasyRandom(&rand);
  }
  else {
    EasyRandom::EasyRandom(&rand,i_random_seed);
  }
  uVar2 = get_num_of_processors();
  local_13b0 = (uVar2 + (uVar2 == 0)) * 4;
  __l._M_len = 1;
  __l._M_array = &local_13b0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&nonblocking_thread_counts,__l,&local_13c9);
  bVar1 = TestSettings::should_run(i_settings,"queue");
  if (bVar1) {
    heter_queue_generic_tests(i_flags,i_output,&rand,i_settings->m_queue_tests_cardinality);
  }
  bVar1 = TestSettings::should_run(i_settings,"conc_queue");
  if (bVar1) {
    concurr_heter_queue_generic_tests(i_flags,i_output,&rand,i_settings->m_queue_tests_cardinality);
  }
  bVar1 = TestSettings::should_run(i_settings,"lf_queue");
  if (bVar1) {
    bVar1 = TestSettings::should_run(i_settings,"relaxed");
    if (bVar1) {
      lf_heter_relaxed_queue_generic_tests
                (i_settings,i_flags,i_output,&rand,&nonblocking_thread_counts);
    }
    bVar1 = TestSettings::should_run(i_settings,"seq_cnst");
    if (bVar1) {
      lf_heter_seq_cst_queue_generic_tests
                (i_settings,i_flags,i_output,&rand,&nonblocking_thread_counts);
    }
  }
  bVar1 = TestSettings::should_run(i_settings,"sp_queue");
  if (bVar1) {
    sp_heter_generic_tests(i_flags,i_output,&rand,i_settings->m_queue_tests_cardinality);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&nonblocking_thread_counts.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void all_queues_generic_tests(
      const TestSettings & i_settings,
      QueueTesterFlags     i_flags,
      std::ostream &       i_output,
      uint32_t             i_random_seed)
    {
        EasyRandom rand      = i_random_seed == 0 ? EasyRandom() : EasyRandom(i_random_seed);
        uint64_t   cpu_count = get_num_of_processors();
        if (cpu_count == 0)
            cpu_count = 1;

#if defined(__GNUC__) && !defined(__clang__)
        /* on travis gcc builds take more time, so we use lees threads. 
                to do: expose the number of threads with a commandline argument */
        std::vector<size_t> const nonblocking_thread_counts{static_cast<size_t>(cpu_count * 2)};
#else
        std::vector<size_t> const nonblocking_thread_counts{static_cast<size_t>(cpu_count * 4)};
#endif

        if (i_settings.should_run("queue"))
            heter_queue_generic_tests(
              i_flags, i_output, rand, i_settings.m_queue_tests_cardinality);

        if (i_settings.should_run("conc_queue"))
            concurr_heter_queue_generic_tests(
              i_flags, i_output, rand, i_settings.m_queue_tests_cardinality);

        if (i_settings.should_run("lf_queue"))
        {
            if (i_settings.should_run("relaxed"))
                lf_heter_relaxed_queue_generic_tests(
                  i_settings, i_flags, i_output, rand, nonblocking_thread_counts);

            if (i_settings.should_run("seq_cnst"))
                lf_heter_seq_cst_queue_generic_tests(
                  i_settings, i_flags, i_output, rand, nonblocking_thread_counts);
        }

        if (i_settings.should_run("sp_queue"))
            sp_heter_generic_tests(i_flags, i_output, rand, i_settings.m_queue_tests_cardinality);
    }